

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

ConstTokenOrSyntax * __thiscall
slang::syntax::CoverageIffClauseSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,CoverageIffClauseSyntax *this,size_t index)

{
  ExpressionSyntax *pEVar1;
  __index_type _Var2;
  undefined4 uVar3;
  uint32_t uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  switch(index) {
  case 0:
    uVar3._0_2_ = (this->iff).kind;
    uVar3._2_1_ = (this->iff).field_0x2;
    uVar3._3_1_ = (this->iff).numFlags;
    uVar4 = (this->iff).rawLen;
    uVar5 = *(undefined4 *)&(this->iff).info;
    uVar6 = *(undefined4 *)((long)&(this->iff).info + 4);
    break;
  case 1:
    uVar3._0_2_ = (this->openParen).kind;
    uVar3._2_1_ = (this->openParen).field_0x2;
    uVar3._3_1_ = (this->openParen).numFlags;
    uVar4 = (this->openParen).rawLen;
    uVar5 = *(undefined4 *)&(this->openParen).info;
    uVar6 = *(undefined4 *)((long)&(this->openParen).info + 4);
    break;
  case 2:
    pEVar1 = (this->expr).ptr;
    if (pEVar1 == (ExpressionSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                );
    }
    *(ExpressionSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         pEVar1;
    _Var2 = '\x01';
    goto LAB_002b2651;
  case 3:
    uVar3._0_2_ = (this->closeParen).kind;
    uVar3._2_1_ = (this->closeParen).field_0x2;
    uVar3._3_1_ = (this->closeParen).numFlags;
    uVar4 = (this->closeParen).rawLen;
    uVar5 = *(undefined4 *)&(this->closeParen).info;
    uVar6 = *(undefined4 *)((long)&(this->closeParen).info + 4);
    break;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_002b264f;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar3;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar6;
LAB_002b264f:
  _Var2 = '\0';
LAB_002b2651:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var2;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax CoverageIffClauseSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return iff;
        case 1: return openParen;
        case 2: return expr.get();
        case 3: return closeParen;
        default: return nullptr;
    }
}